

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.cpp
# Opt level: O0

Error asmjit::v1_14::InstAPI::validate
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  Operand_ *in_RCX;
  Operand_ *in_RDX;
  BaseInst *in_RSI;
  char in_DIL;
  ValidationFlags in_R8D;
  ValidationFlags in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  bool bVar1;
  Error local_8;
  
  bVar1 = in_DIL == '\x01' || in_DIL == '\x02';
  if (bVar1) {
    if (in_DIL == '\x01') {
      local_8 = x86::InstInternal::validateX86
                          ((BaseInst *)in_RDX,in_RCX,
                           CONCAT44(in_R8D,CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffffd2,
                                                                   in_stack_ffffffffffffffd0))),
                           in_stack_ffffffffffffffcc);
    }
    else {
      local_8 = x86::InstInternal::validateX64
                          ((BaseInst *)in_RDX,in_RCX,
                           CONCAT44(in_R8D,CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffffd2,
                                                                   in_stack_ffffffffffffffd0))),
                           in_stack_ffffffffffffffcc);
    }
  }
  else if (in_DIL == '\x06' || in_DIL == '\f') {
    local_8 = a64::InstInternal::validate(in_RSI,in_RDX,(size_t)in_RCX,in_R8D);
  }
  else {
    local_8 = DebugUtils::errored(4);
  }
  return local_8;
}

Assistant:

Error InstAPI::validate(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch)) {
    if (arch == Arch::kX86)
      return x86::InstInternal::validateX86(inst, operands, opCount, validationFlags);
    else
      return x86::InstInternal::validateX64(inst, operands, opCount, validationFlags);
  }
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyAArch64(arch))
    return a64::InstInternal::validate(inst, operands, opCount, validationFlags);
#endif

  return DebugUtils::errored(kErrorInvalidArch);
}